

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

void Gia_ManSimplifyAnd(Vec_Int_t *vSuper)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_1c;
  int This;
  int Prev;
  int k;
  int i;
  Vec_Int_t *vSuper_local;
  
  This = 0;
  local_1c = -1;
  Prev = 0;
  do {
    iVar1 = Vec_IntSize(vSuper);
    if (iVar1 <= Prev) {
      Vec_IntShrink(vSuper,This);
      iVar1 = Vec_IntSize(vSuper);
      if (iVar1 == 0) {
        Vec_IntPush(vSuper,1);
      }
      return;
    }
    iVar1 = Vec_IntEntry(vSuper,Prev);
    if (iVar1 == 0) {
      Vec_IntFill(vSuper,1,0);
      return;
    }
    if (iVar1 != 1) {
      if (local_1c != -1) {
        iVar2 = Abc_Lit2Var(local_1c);
        iVar3 = Abc_Lit2Var(iVar1);
        if (iVar2 == iVar3) {
          if (local_1c != iVar1) {
            Vec_IntFill(vSuper,1,0);
            return;
          }
          goto LAB_0097d380;
        }
      }
      Vec_IntWriteEntry(vSuper,This,iVar1);
      local_1c = iVar1;
      This = This + 1;
    }
LAB_0097d380:
    Prev = Prev + 1;
  } while( true );
}

Assistant:

void Gia_ManSimplifyAnd( Vec_Int_t * vSuper )
{
    int i, k = 0, Prev = -1, This;
    Vec_IntForEachEntry( vSuper, This, i )
    {
        if ( This == 0 )
            { Vec_IntFill(vSuper, 1, 0); return; }
        if ( This == 1 )
            continue;
        if ( Prev == -1 || Abc_Lit2Var(Prev) != Abc_Lit2Var(This) )
            Vec_IntWriteEntry( vSuper, k++, This ), Prev = This;
        else if ( Prev != This )
            { Vec_IntFill(vSuper, 1, 0); return; }
    }
    Vec_IntShrink( vSuper, k );
    if ( Vec_IntSize( vSuper ) == 0 )
        Vec_IntPush( vSuper, 1 );
}